

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int setDecodeDefaults(jpeg_decompress_struct *dinfo,int pixelFormat,int subsamp,int flags)

{
  undefined8 uVar1;
  JQUANT_TBL *pJVar2;
  uint uVar3;
  int in_EDX;
  long in_RDI;
  jpeg_component_info *compptr;
  int i;
  int local_28;
  int local_24;
  j_common_ptr in_stack_ffffffffffffffe0;
  int local_18;
  
  *(undefined4 *)(in_RDI + 0x48) = 1;
  *(undefined4 *)(in_RDI + 0x44) = 1;
  if (in_EDX == 3) {
    *(undefined4 *)(in_RDI + 0x1b0) = 1;
    *(undefined4 *)(in_RDI + 0x38) = 1;
    *(undefined4 *)(in_RDI + 0x3c) = 1;
  }
  else {
    *(undefined4 *)(in_RDI + 0x1b0) = 3;
    *(undefined4 *)(in_RDI + 0x38) = 3;
    *(undefined4 *)(in_RDI + 0x3c) = 3;
  }
  uVar1 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,(long)*(int *)(in_RDI + 0x38) * 0x60);
  *(undefined8 *)(in_RDI + 0x130) = uVar1;
  for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x38); local_18 = local_18 + 1) {
    in_stack_ffffffffffffffe0 = (j_common_ptr)(*(long *)(in_RDI + 0x130) + (long)local_18 * 0x60);
    if (local_18 == 0) {
      local_24 = tjMCUWidth[in_EDX] / 8;
    }
    else {
      local_24 = 1;
    }
    *(int *)&in_stack_ffffffffffffffe0->mem = local_24;
    if (local_18 == 0) {
      local_28 = tjMCUHeight[in_EDX] / 8;
    }
    else {
      local_28 = 1;
    }
    *(int *)((long)&in_stack_ffffffffffffffe0->mem + 4) = local_28;
    *(int *)((long)&in_stack_ffffffffffffffe0->err + 4) = local_18;
    *(int *)&in_stack_ffffffffffffffe0->err = local_18 + 1;
    uVar3 = (uint)(local_18 != 0);
    *(uint *)&in_stack_ffffffffffffffe0->client_data = uVar3;
    *(uint *)((long)&in_stack_ffffffffffffffe0->progress + 4) = uVar3;
    *(uint *)&in_stack_ffffffffffffffe0->progress = uVar3;
    *(j_common_ptr *)(in_RDI + 0x1b8 + (long)local_18 * 8) = in_stack_ffffffffffffffe0;
  }
  *(undefined4 *)(in_RDI + 0x128) = 8;
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    if (*(long *)(in_RDI + 200 + (long)local_18 * 8) == 0) {
      pJVar2 = jpeg_alloc_quant_table(in_stack_ffffffffffffffe0);
      *(JQUANT_TBL **)(in_RDI + 200 + (long)local_18 * 8) = pJVar2;
    }
  }
  return 0;
}

Assistant:

static int setDecodeDefaults(struct jpeg_decompress_struct *dinfo,
                             int pixelFormat, int subsamp, int flags)
{
  int i;

  dinfo->scale_num = dinfo->scale_denom = 1;

  if (subsamp == TJSAMP_GRAY) {
    dinfo->num_components = dinfo->comps_in_scan = 1;
    dinfo->jpeg_color_space = JCS_GRAYSCALE;
  } else {
    dinfo->num_components = dinfo->comps_in_scan = 3;
    dinfo->jpeg_color_space = JCS_YCbCr;
  }

  dinfo->comp_info = (jpeg_component_info *)
    (*dinfo->mem->alloc_small) ((j_common_ptr)dinfo, JPOOL_IMAGE,
                                dinfo->num_components *
                                sizeof(jpeg_component_info));

  for (i = 0; i < dinfo->num_components; i++) {
    jpeg_component_info *compptr = &dinfo->comp_info[i];

    compptr->h_samp_factor = (i == 0) ? tjMCUWidth[subsamp] / 8 : 1;
    compptr->v_samp_factor = (i == 0) ? tjMCUHeight[subsamp] / 8 : 1;
    compptr->component_index = i;
    compptr->component_id = i + 1;
    compptr->quant_tbl_no = compptr->dc_tbl_no =
      compptr->ac_tbl_no = (i == 0) ? 0 : 1;
    dinfo->cur_comp_info[i] = compptr;
  }
  dinfo->data_precision = 8;
  for (i = 0; i < 2; i++) {
    if (dinfo->quant_tbl_ptrs[i] == NULL)
      dinfo->quant_tbl_ptrs[i] = jpeg_alloc_quant_table((j_common_ptr)dinfo);
  }

  return 0;
}